

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_linux.c
# Opt level: O0

void mfb_timer_init(void)

{
  int iVar1;
  timespec res;
  timespec local_10;
  
  iVar1 = clock_getres(1,&local_10);
  if (iVar1 == 0) {
    g_timer_frequency = (double)local_10.tv_nsec * 1000000000.0 + (double)local_10.tv_sec;
  }
  else {
    g_timer_frequency = 1000000000.0;
  }
  g_timer_resolution = 1.0 / g_timer_frequency;
  return;
}

Assistant:

void 
mfb_timer_init() {
    struct timespec res;

    if (clock_getres(kClock, &res) != 0) {
        g_timer_frequency = 1e+9;
    }
    else {
        g_timer_frequency = res.tv_sec + res.tv_nsec * 1e+9;
    }
    g_timer_resolution = 1.0 / g_timer_frequency;
}